

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O3

pair<QHostAddress,_int> __thiscall QHostAddress::parseSubnet(QHostAddress *this,QString *subnet)

{
  Data *pDVar1;
  QNetmask QVar2;
  bool bVar3;
  CutResult CVar4;
  int iVar5;
  QHostAddressPrivate *pQVar6;
  long lVar7;
  ulong uVar8;
  qsizetype qVar9;
  int extraout_EDX;
  int extraout_EDX_00;
  undefined8 extraout_RDX;
  uint uVar10;
  quint32 ip4Addr;
  QHostAddressPrivate *originalLength;
  char16_t *pcVar11;
  QHostAddress QVar12;
  undefined1 *puVar13;
  QStringView *pQVar14;
  int iVar15;
  int iVar16;
  long in_FS_OFFSET;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  pair<QHostAddress,_int> pVar21;
  QStringView QVar22;
  QStringView QVar23;
  bool ok;
  QHostAddress mask;
  QList<QStringView> local_88;
  QNetmask local_61;
  totally_ordered_wrapper<QHostAddressPrivate_*> local_60;
  QStringView *local_58;
  QHostAddress local_50;
  QHostAddress local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QHostAddress((QHostAddress *)&local_88);
  local_48.d.d.ptr =
       (QExplicitlySharedDataPointer<QHostAddressPrivate>)
       (QExplicitlySharedDataPointer<QHostAddressPrivate>)local_88.d.d;
  local_88.d.d = (Data *)0x0;
  local_40 = (undefined1 *)CONCAT44(local_40._4_4_,0xffffffff);
  ~QHostAddress((QHostAddress *)&local_88);
  pDVar1 = (Data *)(subnet->d).size;
  if (pDVar1 != (Data *)0x0) {
    local_88.d.ptr = (QStringView *)(subnet->d).ptr;
    local_88.d.d = pDVar1;
    pQVar6 = (QHostAddressPrivate *)
             QStringView::indexOf((QStringView *)&local_88,(QChar)0x2f,0,CaseSensitive);
    pQVar14 = (QStringView *)(subnet->d).ptr;
    originalLength = (QHostAddressPrivate *)(subnet->d).size;
    local_58 = pQVar14;
    if (pQVar6 == (QHostAddressPrivate *)0xffffffffffffffff) {
      local_88.d.d = (Data *)CONCAT62(local_88.d.d._2_6_,0x3a);
      QVar18.m_data = (storage_type_conflict *)pQVar14;
      QVar18.m_size = (qsizetype)originalLength;
      QVar23.m_data = (storage_type_conflict *)&local_88;
      QVar23.m_size = 1;
      local_60.ptr = originalLength;
      lVar7 = QtPrivate::findString(QVar18,0,QVar23,CaseSensitive);
      if (lVar7 == -1) {
LAB_001acbcc:
        iVar15 = -1;
LAB_001acbd2:
        local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_88.d.ptr = (QStringView *)&DAT_aaaaaaaaaaaaaaaa;
        QStringView::split(&local_88,&local_60,0x2e,0,1);
        if ((undefined1 *)(local_88.d.size + -5) < (undefined1 *)0xfffffffffffffffc) {
LAB_001acd26:
          QHostAddress(this,&local_48);
          *(int *)&this[1].d.d.ptr = (int)local_40;
        }
        else {
          if ((local_88.d.ptr[(long)(local_88.d.size + -1)].m_size == 0) &&
             (QList<QStringView>::removeLast(&local_88),
             (undefined1 *)local_88.d.size == (undefined1 *)0x0)) {
            iVar5 = 0;
            uVar10 = 0;
          }
          else {
            puVar13 = (undefined1 *)0x0;
            lVar7 = 8;
            uVar10 = 0;
            do {
              local_50.d.d.ptr._0_1_ = 0xaa;
              QVar20.m_data = *(storage_type_conflict **)((long)&(local_88.d.ptr)->m_size + lVar7);
              QVar20.m_size = *(qsizetype *)((long)local_88.d.ptr + lVar7 + -8);
              uVar8 = QString::toIntegral_helper(QVar20,(bool *)&local_50,10);
              if (uVar8 >> 0x20 != 0) {
                local_50.d.d.ptr =
                     (QExplicitlySharedDataPointer<QHostAddressPrivate>)
                     ((ulong)local_50.d.d.ptr & 0xffffffffffffff00);
                goto LAB_001acd26;
              }
              if ((0xff < uVar8) || (((ulong)local_50.d.d.ptr & 1) == 0)) goto LAB_001acd26;
              uVar10 = uVar10 << 8 | (uint)uVar8;
              puVar13 = puVar13 + 1;
              lVar7 = lVar7 + 0x10;
            } while (puVar13 < (ulong)local_88.d.size);
            iVar5 = (int)local_88.d.size << 3;
          }
          ip4Addr = uVar10 << (-(char)iVar5 & 0x1fU);
          iVar16 = iVar15;
          if (iVar15 != 0x20) {
            if (iVar15 == 0) {
              ip4Addr = 0;
            }
            else {
              iVar16 = iVar5;
              if (iVar15 != -1) {
                ip4Addr = (ip4Addr >> (-(char)iVar15 & 0x1fU)) << (-(char)iVar15 & 0x1fU);
                iVar16 = iVar15;
              }
            }
          }
          QHostAddress(&local_50,ip4Addr);
          QVar12.d.d.ptr = local_50.d.d.ptr;
          local_50.d.d.ptr =
               (QExplicitlySharedDataPointer<QHostAddressPrivate>)
               (totally_ordered_wrapper<QHostAddressPrivate_*>)0x0;
          (this->d).d.ptr = (QHostAddressPrivate *)QVar12;
          *(int *)&this[1].d.d.ptr = iVar16;
          ~QHostAddress(&local_50);
        }
        if ((QHostAddressPrivate *)local_88.d.d != (QHostAddressPrivate *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,0x10,0x10);
          }
        }
        goto LAB_001acce4;
      }
LAB_001ac9fd:
      uVar8 = 0x80;
LAB_001aca03:
      local_50.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QHostAddress(&local_50);
      QString::QString((QString *)&local_88,(QChar *)local_58,(longlong)local_60.ptr);
      bVar3 = setAddress(&local_50,(QString *)&local_88);
      iVar15 = extraout_EDX;
      if ((QHostAddressPrivate *)local_88.d.d != (QHostAddressPrivate *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
          iVar15 = extraout_EDX_00;
        }
      }
      if (bVar3) {
        clearBits((quint8 *)((long)local_50.d.d.ptr + 0x20),(int)uVar8,iVar15);
        QHostAddress(this,&local_50);
        iVar15 = (int)uVar8;
      }
      else {
        QHostAddress(this,&local_48);
        iVar15 = (int)local_40;
      }
      *(int *)&this[1].d.d.ptr = iVar15;
LAB_001accda:
      ~QHostAddress(&local_50);
      goto LAB_001acce4;
    }
    local_88.d.d = (Data *)CONCAT62(local_88.d.d._2_6_,0x3a);
    QVar17.m_data = (storage_type_conflict *)pQVar14;
    QVar17.m_size = (qsizetype)pQVar6;
    QVar22.m_data = (storage_type_conflict *)&local_88;
    QVar22.m_size = 1;
    local_60.ptr = pQVar6;
    lVar7 = QtPrivate::findString(QVar17,0,QVar22,CaseSensitive);
    pQVar6 = (QHostAddressPrivate *)
             ((long)&(((QBasicAtomicInt *)&pQVar6->super_QSharedData)->_q_value).
                     super___atomic_base<int>._M_i + 1);
    if (lVar7 == -1) {
      local_88.d.d = (Data *)originalLength;
      local_88.d.ptr = pQVar14;
      qVar9 = QStringView::indexOf
                        ((QStringView *)&local_88,(QChar)0x2e,(qsizetype)pQVar6,CaseSensitive);
      if (qVar9 == -1) {
        pQVar14 = (QStringView *)(subnet->d).ptr;
        originalLength = (QHostAddressPrivate *)(subnet->d).size;
        goto LAB_001ac988;
      }
      local_50.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QHostAddress(&local_50);
      local_61.length = 0xff;
      QString::mid((longlong)&local_88,(longlong)subnet);
      bVar3 = setAddress(&local_50,(QString *)&local_88);
      if ((QHostAddressPrivate *)local_88.d.d != (QHostAddressPrivate *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((!bVar3) ||
         (bVar3 = QNetmask::setAddress(&local_61,&local_50), QVar2.length = local_61.length, !bVar3)
         ) {
        QHostAddress(this,&local_48);
        *(int *)&this[1].d.d.ptr = (int)local_40;
        goto LAB_001accda;
      }
      uVar8 = (ulong)local_61.length;
      ~QHostAddress(&local_50);
      if (QVar2.length == 0xff) goto LAB_001acbcc;
LAB_001acbc0:
      iVar15 = (int)uVar8;
      if (iVar15 < 0x21) goto LAB_001acbd2;
    }
    else {
LAB_001ac988:
      local_61.length = 0xaa;
      local_50.d.d.ptr =
           (QExplicitlySharedDataPointer<QHostAddressPrivate>)
           (totally_ordered_wrapper<QHostAddressPrivate_*>)0xffffffffffffffff;
      local_88.d.d = (Data *)pQVar6;
      CVar4 = QtPrivate::QContainerImplHelper::mid
                        ((qsizetype)originalLength,(qsizetype *)&local_88,(qsizetype *)&local_50);
      if (CVar4 == Null) {
        QVar12.d.d.ptr =
             (QExplicitlySharedDataPointer<QHostAddressPrivate>)
             (totally_ordered_wrapper<QHostAddressPrivate_*>)0x0;
        pcVar11 = (char16_t *)0x0;
      }
      else {
        pcVar11 = (char16_t *)((long)&pQVar14->m_size + local_88.d.d * 2);
        QVar12.d.d.ptr = local_50.d.d.ptr;
      }
      QVar19.m_data = pcVar11;
      QVar19.m_size = (qsizetype)QVar12.d.d.ptr;
      uVar8 = QString::toIntegral_helper(QVar19,(bool *)&local_61,10);
      if (uVar8 >> 0x20 == 0) {
        if ((local_61.length & 1) != 0) {
          if (lVar7 == -1) goto LAB_001acbc0;
          if ((int)uVar8 < 0x81) {
            if ((int)uVar8 < 0) goto LAB_001ac9fd;
            goto LAB_001aca03;
          }
        }
      }
      else {
        local_61.length = 0;
      }
    }
  }
  QHostAddress(this,&local_48);
  *(int *)&this[1].d.d.ptr = (int)local_40;
LAB_001acce4:
  ~QHostAddress(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  pVar21._8_8_ = extraout_RDX;
  pVar21.first.d.d.ptr =
       (QExplicitlySharedDataPointer<QHostAddressPrivate>)
       (QExplicitlySharedDataPointer<QHostAddressPrivate>)this;
  return pVar21;
}

Assistant:

std::pair<QHostAddress, int> QHostAddress::parseSubnet(const QString &subnet)
{
    // We support subnets in the form:
    //   ddd.ddd.ddd.ddd/nn
    //   ddd.ddd.ddd/nn
    //   ddd.ddd/nn
    //   ddd/nn
    //   ddd.ddd.ddd.
    //   ddd.ddd.ddd
    //   ddd.ddd.
    //   ddd.ddd
    //   ddd.
    //   ddd
    //   <ipv6-address>/nn
    //
    //  where nn can be an IPv4-style netmask for the IPv4 forms

    const std::pair<QHostAddress, int> invalid = std::pair(QHostAddress(), -1);
    if (subnet.isEmpty())
        return invalid;

    qsizetype slash = subnet.indexOf(u'/');
    QStringView netStr(subnet);
    if (slash != -1)
        netStr.truncate(slash);

    int netmask = -1;
    bool isIpv6 = netStr.contains(u':');

    if (slash != -1) {
        // is the netmask given in IP-form or in bit-count form?
        if (!isIpv6 && subnet.indexOf(u'.', slash + 1) != -1) {
            // IP-style, convert it to bit-count form
            QHostAddress mask;
            QNetmask parser;
            if (!mask.setAddress(subnet.mid(slash + 1)))
                return invalid;
            if (!parser.setAddress(mask))
                return invalid;
            netmask = parser.prefixLength();
        } else {
            bool ok;
            netmask = QStringView{subnet}.mid(slash + 1).toUInt(&ok);
            if (!ok)
                return invalid;     // failed to parse the subnet
        }
    }

    if (isIpv6) {
        // looks like it's an IPv6 address
        if (netmask > 128)
            return invalid;     // invalid netmask
        if (netmask < 0)
            netmask = 128;

        QHostAddress net;
        if (!net.setAddress(netStr.toString()))
            return invalid;     // failed to parse the IP

        clearBits(net.d->a6.c, netmask, 128);
        return std::pair(net, netmask);
    }

    if (netmask > 32)
        return invalid;         // invalid netmask

    // parse the address manually
    auto parts = netStr.split(u'.');
    if (parts.isEmpty() || parts.size() > 4)
        return invalid;         // invalid IPv4 address

    if (parts.constLast().isEmpty())
        parts.removeLast();

    quint32 addr = 0;
    for (int i = 0; i < parts.size(); ++i) {
        bool ok;
        uint byteValue = parts.at(i).toUInt(&ok);
        if (!ok || byteValue > 255)
            return invalid;     // invalid IPv4 address

        addr <<= 8;
        addr += byteValue;
    }
    addr <<= 8 * (4 - parts.size());
    if (netmask == -1) {
        netmask = 8 * parts.size();
    } else if (netmask == 0) {
        // special case here
        // x86's instructions "shr" and "shl" do not operate when
        // their argument is 32, so the code below doesn't work as expected
        addr = 0;
    } else if (netmask != 32) {
        // clear remaining bits
        quint32 mask = quint32(0xffffffff) >> (32 - netmask) << (32 - netmask);
        addr &= mask;
    }

    return std::pair(QHostAddress(addr), netmask);
}